

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

bool IsGoodConstantArray(ExpressionContext *ctx,VmModule *module,VmInstruction *instInit)

{
  bool bVar1;
  uint uVar2;
  VmValue **ppVVar3;
  VmInstruction *instInit_00;
  VmConstant *pVVar4;
  VmConstant *element;
  VmInstruction *elementInst;
  VmValue *elementValue;
  uint i;
  VmInstruction *instInit_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  if (instInit->cmd != VM_INST_ARRAY) {
    __assert_fail("instInit->cmd == VM_INST_ARRAY",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0xc34,
                  "bool IsGoodConstantArray(ExpressionContext &, VmModule *, VmInstruction *)");
  }
  elementValue._4_4_ = 0;
  do {
    uVar2 = SmallArray<VmValue_*,_4U>::size(&instInit->arguments);
    if (uVar2 <= elementValue._4_4_) {
      return true;
    }
    ppVVar3 = SmallArray<VmValue_*,_4U>::operator[](&instInit->arguments,elementValue._4_4_);
    elementInst = (VmInstruction *)*ppVVar3;
    instInit_00 = getType<VmInstruction>((VmValue *)elementInst);
    if (instInit_00 == (VmInstruction *)0x0) {
LAB_0034e645:
      pVVar4 = getType<VmConstant>(&elementInst->super_VmValue);
      if ((pVVar4 == (VmConstant *)0x0) || ((pVVar4->isReference & 1U) != 0)) {
        return false;
      }
      if (((((pVVar4->super_VmValue).type.type != VM_TYPE_INT) &&
           ((pVVar4->super_VmValue).type.type != VM_TYPE_DOUBLE)) &&
          ((pVVar4->super_VmValue).type.type != VM_TYPE_LONG)) &&
         (((pVVar4->super_VmValue).type.type != VM_TYPE_STRUCT || (pVVar4->sValue == (char *)0x0))))
      {
        return false;
      }
    }
    else {
      if (instInit_00->cmd == VM_INST_DOUBLE_TO_FLOAT) {
        ppVVar3 = SmallArray<VmValue_*,_4U>::operator[](&instInit_00->arguments,0);
        elementInst = (VmInstruction *)*ppVVar3;
        goto LAB_0034e645;
      }
      if (instInit_00->cmd != VM_INST_ARRAY) {
        RunConstantPropagation(ctx,module,&instInit_00->super_VmValue,true);
        ppVVar3 = SmallArray<VmValue_*,_4U>::operator[](&instInit->arguments,elementValue._4_4_);
        elementInst = (VmInstruction *)*ppVVar3;
        goto LAB_0034e645;
      }
      bVar1 = IsGoodConstantArray(ctx,module,instInit_00);
      if (!bVar1) goto LAB_0034e645;
    }
    elementValue._4_4_ = elementValue._4_4_ + 1;
  } while( true );
}

Assistant:

bool IsGoodConstantArray(ExpressionContext &ctx, VmModule *module, VmInstruction *instInit)
{
	assert(instInit->cmd == VM_INST_ARRAY);

	for(unsigned i = 0; i < instInit->arguments.size(); i++)
	{
		VmValue *elementValue = instInit->arguments[i];

		if(VmInstruction *elementInst = getType<VmInstruction>(elementValue))
		{
			if(elementInst->cmd == VM_INST_DOUBLE_TO_FLOAT)
			{
				elementValue = elementInst->arguments[0];
			}
			else if(elementInst->cmd == VM_INST_ARRAY)
			{
				if(IsGoodConstantArray(ctx, module, elementInst))
					continue;
			}
			else
			{
				RunConstantPropagation(ctx, module, elementInst, true);
				elementValue = instInit->arguments[i];
			}
		}

		VmConstant *element = getType<VmConstant>(elementValue);

		if(!element || element->isReference)
			return false;

		if(element->type.type == VM_TYPE_INT)
			continue;
		else if(element->type.type == VM_TYPE_DOUBLE)
			continue;
		else if(element->type.type == VM_TYPE_LONG)
			continue;
		else if(element->type.type == VM_TYPE_STRUCT && element->sValue)
			continue;

		return false;
	}

	return true;
}